

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_any_construct_any_const.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  int iVar2;
  undefined4 extraout_var;
  double *pdVar3;
  any b;
  any a;
  
  b._value = (erasure *)0x400921f9f01b866e;
  type::any::any<double>(&a,(double *)&b);
  iVar2 = (*(a._value)->_vptr_erasure[2])();
  b._value = (erasure *)CONCAT44(extraout_var,iVar2);
  pdVar3 = type::any::as<double>(&b);
  dVar1 = *pdVar3;
  if (b._value != (erasure *)0x0) {
    (*(b._value)->_vptr_erasure[1])();
  }
  if (a._value != (erasure *)0x0) {
    (*(a._value)->_vptr_erasure[1])();
  }
  return -(uint)(dVar1 != 3.14159);
}

Assistant:

int main() {
  try {
    type::any a(3.14159);
    type::any b(a);
    if(b.as<double>() == 3.14159) {
      return 0;
    }
    return -1;
  }
  catch(...) {
    return -1;
  }
}